

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O2

int ncnn::binary_op_no_broadcast<ncnn::BinaryOp_x86_functor::binary_op_div>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  undefined1 auVar3 [16];
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  undefined1 in_XMM2 [16];
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  
  iVar10 = a->h * a->w * a->d * a->elempack;
  uVar13 = 0;
  uVar11 = (ulong)(uint)a->c;
  if (a->c < 1) {
    uVar11 = uVar13;
  }
  for (; uVar13 != uVar11; uVar13 = uVar13 + 1) {
    lVar14 = a->elemsize * a->cstep * uVar13;
    pvVar4 = a->data;
    lVar15 = b->elemsize * b->cstep * uVar13;
    pvVar5 = b->data;
    lVar16 = c->elemsize * c->cstep * uVar13;
    pvVar6 = c->data;
    lVar12 = 0;
    lVar17 = 0;
    for (iVar18 = 0; iVar18 + 3 < iVar10; iVar18 = iVar18 + 4) {
      pfVar1 = (float *)((long)pvVar4 + lVar17 + lVar14);
      fVar7 = pfVar1[1];
      fVar8 = pfVar1[2];
      fVar9 = pfVar1[3];
      auVar3 = *(undefined1 (*) [16])((long)pvVar5 + lVar17 + lVar15);
      in_XMM2 = rcpps(in_XMM2,auVar3);
      fVar19 = *pfVar1 * in_XMM2._0_4_;
      fVar20 = fVar7 * in_XMM2._4_4_;
      fVar21 = fVar8 * in_XMM2._8_4_;
      fVar22 = fVar9 * in_XMM2._12_4_;
      pfVar2 = (float *)((long)pvVar6 + lVar17 + lVar16);
      *pfVar2 = (*pfVar1 - auVar3._0_4_ * fVar19) * in_XMM2._0_4_ + fVar19;
      pfVar2[1] = (fVar7 - auVar3._4_4_ * fVar20) * in_XMM2._4_4_ + fVar20;
      pfVar2[2] = (fVar8 - auVar3._8_4_ * fVar21) * in_XMM2._8_4_ + fVar21;
      pfVar2[3] = (fVar9 - auVar3._12_4_ * fVar22) * in_XMM2._12_4_ + fVar22;
      lVar17 = lVar17 + 0x10;
      lVar12 = lVar12 + 4;
    }
    for (; (int)lVar12 < iVar10; lVar12 = lVar12 + 1) {
      *(float *)((long)pvVar6 + lVar12 * 4 + lVar16) =
           *(float *)((long)pvVar4 + lVar12 * 4 + lVar14) /
           *(float *)((long)pvVar5 + lVar12 * 4 + lVar15);
    }
  }
  return iVar10;
}

Assistant:

static int binary_op_no_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    const int channels = a.c;
    const int size = a.w * a.h * a.d * a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}